

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

ssize_t __thiscall
nanovdb::io::GridMetaData::read(GridMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  char *__s;
  ssize_t extraout_RAX;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  long *plVar2;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  std::istream::read((char *)plVar2,(long)this);
  __s = (char *)operator_new__((ulong)(this->super_MetaData).nameSize);
  std::istream::read((char *)plVar2,(long)__s);
  pcVar1 = (char *)(this->gridName)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->gridName,0,pcVar1,(ulong)__s);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    operator_delete__(__s);
    return extraout_RAX;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Failed reading GridMetaData");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void GridMetaData::read(std::istream& is)
{
    is.read(reinterpret_cast<char*>(this), sizeof(MetaData));
    std::unique_ptr<char[]> tmp(new char[nameSize]);
    is.read(reinterpret_cast<char*>(tmp.get()), nameSize);
    gridName.assign(tmp.get());
    if (!is)
        throw std::runtime_error("Failed reading GridMetaData");
}